

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionSet.cpp
# Opt level: O0

void __thiscall
OpenMD::SelectionSet::flip
          (SelectionSet *this,vector<int,_std::allocator<int>_> *fromIndex,
          vector<int,_std::allocator<int>_> *toIndex)

{
  vector<int,_std::allocator<int>_> *in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *in_RDI;
  int i;
  size_t in_stack_00000080;
  size_t in_stack_00000088;
  OpenMDBitSet *in_stack_00000090;
  undefined4 local_1c;
  
  for (local_1c = 0; local_1c < 6; local_1c = local_1c + 1) {
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
              (in_RDI,(long)local_1c);
    std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)local_1c);
    std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)local_1c);
    OpenMDBitSet::flip(in_stack_00000090,in_stack_00000088,in_stack_00000080);
  }
  return;
}

Assistant:

void SelectionSet::flip(std::vector<int> fromIndex,
                          std::vector<int> toIndex) {
    for (int i = 0; i < N_SELECTIONTYPES; i++)
      bitsets_[i].flip(fromIndex[i], toIndex[i]);
  }